

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

BaseState<true> * __thiscall
LabelObjectState<true>::EndObject(LabelObjectState<true> *this,Context<true> *ctx,SizeType param_2)

{
  if (this->found_cb == true) {
    v_array<CB::cb_class>::push_back((v_array<CB::cb_class> *)&(ctx->ex->l).simple,&this->cb_label);
    this->found_cb = false;
    (this->cb_label).cost = 0.0;
    (this->cb_label).action = 0;
    (this->cb_label).probability = 0.0;
    (this->cb_label).partial_prediction = 0.0;
  }
  else if (this->found == true) {
    count_label(ctx->all->sd,(ctx->ex->l).simple.label);
    this->found = false;
  }
  return this->return_state;
}

Assistant:

BaseState<audit>* EndObject(Context<audit>& ctx, rapidjson::SizeType)
  {
    if (found_cb)
    {
      CB::label* ld = (CB::label*)&ctx.ex->l;
      ld->costs.push_back(cb_label);

      found_cb = false;
      cb_label = {0., 0, 0., 0.};
    }
    else if (found)
    {
      count_label(ctx.all->sd, ctx.ex->l.simple.label);

      found = false;
    }

    return return_state;
  }